

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::exception::eval_error::format_types_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,Const_Proxy_Function *t_func,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  bool bVar1;
  element_type *peVar2;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *__x;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  size_type sVar6;
  element_type *peVar7;
  AST_Node *pAVar8;
  undefined7 in_register_00000009;
  char *__s;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynfunguard;
  Proxy_Function f;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynfun;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  size_type local_230;
  size_t index;
  string paramstr;
  stringstream ss;
  ostream local_1f8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  byte local_49;
  undefined1 local_48 [8];
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  int arity;
  Dispatch_Engine *t_ss_local;
  bool t_dot_notation_local;
  Const_Proxy_Function *t_func_local;
  string *retval;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         dispatch::Proxy_Function_Base::get_arity(peVar2);
    peVar2 = std::
             __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    __x = dispatch::Proxy_Function_Base::get_param_types(peVar2);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_48,__x
              );
    local_49 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    if (types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == -1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,"(...)");
      if (((ulong)t_func & 1) != 0) {
        std::operator+(&local_80,"(Object).",__return_storage_ptr__);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
    }
    else {
      sVar3 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                        ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                         local_48);
      if (sVar3 < 2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,"()");
      }
      else {
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)(paramstr.field_2._M_local_buf + 8));
        std::operator<<(local_1f8,"(");
        std::__cxx11::string::string((string *)&index);
        for (local_230 = 1; sVar3 = local_230,
            sVar4 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                *)local_48), sVar3 != sVar4; local_230 = local_230 + 1) {
          pvVar5 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                   operator[]((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               *)local_48,local_230);
          bVar1 = Type_Info::is_const(pvVar5);
          __s = "";
          if (bVar1) {
            __s = "const ";
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,__s
                    );
          pvVar5 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                   operator[]((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               *)local_48,local_230);
          detail::Dispatch_Engine::get_type_name_abi_cxx11_
                    (&local_250,(Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation),
                     pvVar5);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                     &local_250);
          std::__cxx11::string::~string((string *)&local_250);
          if ((local_230 == 1) && (((ulong)t_func & 1) != 0)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       ").(");
            sVar3 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                *)local_48);
            if (sVar3 == 2) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index
                         ,", ");
            }
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       ", ");
          }
        }
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,0,
                   sVar6 - 2);
        std::operator<<(local_1f8,(string *)&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::operator<<(local_1f8,")");
        std::__cxx11::stringstream::str();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dynfun.
                    super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &dynfun.
                    super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&index);
        std::__cxx11::stringstream::~stringstream
                  ((stringstream *)(paramstr.field_2._M_local_buf + 8));
      }
    }
    std::
    dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base_const>
              ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)
               &f.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &f.
                        super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&f.
                                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      bVar1 = dispatch::Dynamic_Proxy_Function::has_parse_tree(peVar7);
      if (bVar1) {
        std::
        __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&f.
                         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
        dispatch::Dynamic_Proxy_Function::get_guard
                  ((Dynamic_Proxy_Function *)
                   &dynfunguard.
                    super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &dynfunguard.
                            super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        if (bVar1) {
          std::
          dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
                    ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_2c0);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2c0);
          if (bVar1) {
            peVar7 = std::
                     __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2c0);
            bVar1 = dispatch::Dynamic_Proxy_Function::has_parse_tree(peVar7);
            if (bVar1) {
              peVar7 = std::
                       __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2c0);
              pAVar8 = dispatch::Dynamic_Proxy_Function::get_parse_tree(peVar7);
              format_guard<chaiscript::AST_Node>(&local_300,pAVar8);
              std::operator+(&local_2e0," : ",&local_300);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=(__return_storage_ptr__,&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::__cxx11::string::~string((string *)&local_300);
            }
          }
          std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
                    ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)local_2c0);
        }
        peVar7 = std::
                 __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&f.
                                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pAVar8 = dispatch::Dynamic_Proxy_Function::get_parse_tree(peVar7);
        format_location<chaiscript::AST_Node>(&local_340,pAVar8);
        std::operator+(&local_320,"\n          Defined at ",&local_340);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
                  ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
                   &dynfunguard.
                    super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
    local_49 = 1;
    std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
              ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)
               &f.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if ((local_49 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("t_func",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_common.hpp"
                ,0x18a,
                "static std::string chaiscript::exception::eval_error::format_types(const Const_Proxy_Function &, bool, const chaiscript::detail::Dispatch_Engine &)"
               );
}

Assistant:

static std::string format_types(const Const_Proxy_Function &t_func, bool t_dot_notation, const chaiscript::detail::Dispatch_Engine &t_ss) {
        assert(t_func);
        int arity = t_func->get_arity();
        std::vector<Type_Info> types = t_func->get_param_types();

        std::string retval;
        if (arity == -1) {
          retval = "(...)";
          if (t_dot_notation) {
            retval = "(Object)." + retval;
          }
        } else if (types.size() <= 1) {
          retval = "()";
        } else {
          std::stringstream ss;
          ss << "(";

          std::string paramstr;

          for (size_t index = 1; index != types.size(); ++index) {
            paramstr += (types[index].is_const() ? "const " : "");
            paramstr += t_ss.get_type_name(types[index]);

            if (index == 1 && t_dot_notation) {
              paramstr += ").(";
              if (types.size() == 2) {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);

          ss << ")";
          retval = ss.str();
        }

        std::shared_ptr<const dispatch::Dynamic_Proxy_Function> dynfun
            = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_func);

        if (dynfun && dynfun->has_parse_tree()) {
          Proxy_Function f = dynfun->get_guard();

          if (f) {
            auto dynfunguard = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(f);
            if (dynfunguard && dynfunguard->has_parse_tree()) {
              retval += " : " + format_guard(dynfunguard->get_parse_tree());
            }
          }

          retval += "\n          Defined at " + format_location(dynfun->get_parse_tree());
        }

        return retval;
      }